

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Shape.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Shape_Material(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer pFVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  CX3DImporter_NodeElement_Material *pCVar6;
  allocator<char> local_e9;
  string local_e8;
  undefined4 local_c8;
  allocator<char> local_c1;
  undefined1 local_c0 [8];
  string an;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  aiColor3D specularColor;
  aiColor3D emissiveColor;
  undefined1 local_68 [8];
  aiColor3D diffuseColor;
  float transparency;
  float shininess;
  float ambientIntensity;
  string def;
  string use;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&shininess);
  transparency = 0.2;
  diffuseColor.b = 0.2;
  diffuseColor.g = 0.0;
  aiColor3D::aiColor3D((aiColor3D *)local_68,0.8,0.8,0.8);
  aiColor3D::aiColor3D((aiColor3D *)&specularColor.g,0.0,0.0,0.0);
  aiColor3D::aiColor3D((aiColor3D *)((long)&ne + 4),0.0,0.0,0.0);
  _idx_end = (CX3DImporter_NodeElement_Material *)0x0;
  an.field_2._12_4_ = 0;
  pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  an.field_2._8_4_ =
       (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)an.field_2._12_4_ < (int)an.field_2._8_4_; an.field_2._12_4_ = an.field_2._12_4_ + 1)
  {
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar4,(ulong)(uint)an.field_2._12_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c0,(char *)CONCAT44(extraout_var,iVar2),&local_c1);
    std::allocator<char>::~allocator(&local_c1);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c0,"DEF");
    if (bVar1) {
      pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar4,(ulong)(uint)an.field_2._12_4_);
      std::__cxx11::string::operator=((string *)&shininess,(char *)CONCAT44(extraout_var_00,iVar2));
      local_c8 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c0,"USE");
      if (bVar1) {
        pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar4,(ulong)(uint)an.field_2._12_4_);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar2))
        ;
        local_c8 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c0,"bboxCenter");
        if (bVar1) {
          local_c8 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_c0,"bboxSize");
          if (bVar1) {
            local_c8 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c0,"containerField");
            if (bVar1) {
              local_c8 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_c0,"ambientIntensity");
              if (bVar1) {
                transparency = XML_ReadNode_GetAttrVal_AsFloat(this,an.field_2._12_4_);
                local_c8 = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_c0,"shininess");
                if (bVar1) {
                  diffuseColor.b = XML_ReadNode_GetAttrVal_AsFloat(this,an.field_2._12_4_);
                  local_c8 = 4;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_c0,"transparency");
                  if (bVar1) {
                    diffuseColor.g = XML_ReadNode_GetAttrVal_AsFloat(this,an.field_2._12_4_);
                    local_c8 = 4;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_c0,"diffuseColor");
                    if (bVar1) {
                      XML_ReadNode_GetAttrVal_AsCol3f(this,an.field_2._12_4_,(aiColor3D *)local_68);
                      local_c8 = 4;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_c0,"emissiveColor");
                      if (bVar1) {
                        XML_ReadNode_GetAttrVal_AsCol3f
                                  (this,an.field_2._12_4_,(aiColor3D *)&specularColor.g);
                        local_c8 = 4;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_c0,"specularColor");
                        if (bVar1) {
                          XML_ReadNode_GetAttrVal_AsCol3f
                                    (this,an.field_2._12_4_,(aiColor3D *)((long)&ne + 4));
                          local_c8 = 4;
                        }
                        else {
                          Throw_IncorrectAttr(this,(string *)local_c0);
                          local_c8 = 0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_c0);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_Material,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    pCVar6 = (CX3DImporter_NodeElement_Material *)operator_new(0x80);
    CX3DImporter_NodeElement_Material::CX3DImporter_NodeElement_Material
              (pCVar6,this->NodeElement_Cur);
    _idx_end = pCVar6;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,(string *)&shininess);
    }
    _idx_end->AmbientIntensity = transparency;
    _idx_end->Shininess = diffuseColor.b;
    _idx_end->Transparency = diffuseColor.g;
    aiColor3D::operator=(&_idx_end->DiffuseColor,(aiColor3D *)local_68);
    aiColor3D::operator=(&_idx_end->EmissiveColor,(aiColor3D *)&specularColor.g);
    aiColor3D::operator=(&_idx_end->SpecularColor,(aiColor3D *)((long)&ne + 4));
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar6 = _idx_end;
    if ((uVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Material",&local_e9);
      ParseNode_Metadata(this,&pCVar6->super_CX3DImporter_NodeElement,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::__cxx11::string::~string((string *)&shininess);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Shape_Material()
{
    std::string use, def;
    float ambientIntensity = 0.2f;
    float shininess = 0.2f;
    float transparency = 0;
    aiColor3D diffuseColor(0.8f, 0.8f, 0.8f);
    aiColor3D emissiveColor(0, 0, 0);
    aiColor3D specularColor(0, 0, 0);
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ambientIntensity", ambientIntensity, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("shininess", shininess, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("transparency", transparency, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("diffuseColor", diffuseColor, XML_ReadNode_GetAttrVal_AsCol3f);
		MACRO_ATTRREAD_CHECK_REF("emissiveColor", emissiveColor, XML_ReadNode_GetAttrVal_AsCol3f);
		MACRO_ATTRREAD_CHECK_REF("specularColor", specularColor, XML_ReadNode_GetAttrVal_AsCol3f);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Material, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Material(NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		((CX3DImporter_NodeElement_Material*)ne)->AmbientIntensity = ambientIntensity;
		((CX3DImporter_NodeElement_Material*)ne)->Shininess = shininess;
		((CX3DImporter_NodeElement_Material*)ne)->Transparency = transparency;
		((CX3DImporter_NodeElement_Material*)ne)->DiffuseColor = diffuseColor;
		((CX3DImporter_NodeElement_Material*)ne)->EmissiveColor = emissiveColor;
		((CX3DImporter_NodeElement_Material*)ne)->SpecularColor = specularColor;
        // check for child nodes
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Material");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}